

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

htab_hash_t proto_hash(MIR_item_t pi,void *arg)

{
  MIR_proto_t pMVar1;
  char *key;
  int iVar2;
  MIR_var_t *pMVar3;
  uint64_t uVar4;
  size_t sVar5;
  size_t len;
  uint64_t key_00;
  ulong local_40;
  size_t i_1;
  uint64_t uStack_30;
  uint32_t i;
  uint64_t h;
  MIR_var_t *args;
  MIR_proto_t p;
  void *arg_local;
  MIR_item_t pi_local;
  
  pMVar1 = (pi->u).proto;
  pMVar3 = VARR_MIR_var_taddr(pMVar1->args);
  uVar4 = mir_hash_init(0x2a);
  uVar4 = mir_hash_step(uVar4,(ulong)pMVar1->nres);
  uStack_30 = mir_hash_step(uVar4,(long)pMVar1->vararg_p);
  for (i_1._4_4_ = 0; i_1._4_4_ < pMVar1->nres; i_1._4_4_ = i_1._4_4_ + 1) {
    uStack_30 = mir_hash_step(uStack_30,(ulong)pMVar1->res_types[i_1._4_4_]);
  }
  local_40 = 0;
  while( true ) {
    sVar5 = VARR_MIR_var_tlength(pMVar1->args);
    if (sVar5 <= local_40) break;
    uVar4 = mir_hash_step(uStack_30,(ulong)pMVar3[local_40].type);
    key = pMVar3[local_40].name;
    len = strlen(pMVar3[local_40].name);
    key_00 = mir_hash(key,len,0x18);
    uStack_30 = mir_hash_step(uVar4,key_00);
    iVar2 = MIR_all_blk_type_p(pMVar3[local_40].type);
    if (iVar2 != 0) {
      uStack_30 = mir_hash_step(uStack_30,pMVar3[local_40].size);
    }
    local_40 = local_40 + 1;
  }
  uVar4 = mir_hash_finish(uStack_30);
  return (htab_hash_t)uVar4;
}

Assistant:

static htab_hash_t proto_hash (MIR_item_t pi, void *arg MIR_UNUSED) {
  MIR_proto_t p = pi->u.proto;
  MIR_var_t *args = VARR_ADDR (MIR_var_t, p->args);
  uint64_t h = mir_hash_init (42);

  h = mir_hash_step (h, p->nres);
  h = mir_hash_step (h, p->vararg_p);
  for (uint32_t i = 0; i < p->nres; i++) h = mir_hash_step (h, p->res_types[i]);
  for (size_t i = 0; i < VARR_LENGTH (MIR_var_t, p->args); i++) {
    h = mir_hash_step (h, args[i].type);
    h = mir_hash_step (h, mir_hash (args[i].name, strlen (args[i].name), 24));
    if (MIR_all_blk_type_p (args[i].type)) h = mir_hash_step (h, args[i].size);
  }
  return (htab_hash_t) mir_hash_finish (h);
}